

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Seanet.h
# Opt level: O2

int GetHeadDataSeanet(SEANET *pSeanet,uchar *scanline,double *pAngle)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = SendDataRequestSeanet(pSeanet);
  if (iVar1 == 0) {
    iVar1 = HeadDataReplySeanet(pSeanet,scanline,pAngle);
    uVar2 = (uint)(iVar1 != 0);
  }
  else {
    uVar2 = 1;
  }
  return uVar2;
}

Assistant:

inline int GetHeadDataSeanet(SEANET* pSeanet, unsigned char* scanline, double* pAngle)
{
	if (SendDataRequestSeanet(pSeanet) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	if (HeadDataReplySeanet(pSeanet, scanline, pAngle) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	// Last data...?

	return EXIT_SUCCESS;
}